

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O1

bool Js::DateImplementation::UtcTimeFromStrCore
               (char16 *psz,uint ulength,double *retVal,ScriptContext *scriptContext)

{
  size_t requestedBytes;
  WCHAR WVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  WCHAR WVar5;
  BOOL BVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 *puVar10;
  TempArenaAllocatorObject *tempAllocator;
  WCHAR *str;
  CharClassifier *this;
  ulong uVar11;
  undefined *puVar12;
  long lVar13;
  WCHAR *pWVar14;
  int local_b0;
  int local_94;
  ulong local_60;
  
  uVar11 = (ulong)ulength;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x3e1,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_00b4c3f0;
    *puVar10 = 0;
  }
  if (0x7ffffffe < ulength) goto LAB_00b4c39f;
  if (psz != (char16 *)0x0) {
    bVar4 = TryParseIsoString(psz,uVar11,retVal,scriptContext);
    if (bVar4) goto LAB_00b4c39f;
    tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"UtcTimeFromStr");
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00b4c3f0;
      *puVar10 = 0;
    }
    requestedBytes = uVar11 * 2 + 2;
    str = (WCHAR *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&(tempAllocator->allocator).
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,requestedBytes);
    if (str == (WCHAR *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00b4c3f0:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    js_memcpy_s(str,requestedBytes,psz,requestedBytes);
    _wcslwr_unsafe(str,uVar11 + 1);
    this = ScriptContext::GetCharClassifier(scriptContext);
    __tls_get_addr(&PTR_0155fe48);
    local_60 = 0;
    local_94 = 0;
    local_b0 = 0;
switchD_00b4b7dc_caseD_2c:
    do {
      do {
        WVar5 = *str;
        if (WVar5 == L'\0') {
          WVar5 = L'\0';
          pWVar14 = str;
        }
        else {
          do {
            bVar4 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)WVar5);
            if (!bVar4) {
              WVar5 = *str;
              pWVar14 = str;
              goto LAB_00b4b7b4;
            }
            WVar5 = str[1];
            str = str + 1;
          } while (WVar5 != L'\0');
          WVar5 = L'\0';
          pWVar14 = str;
        }
LAB_00b4b7b4:
        if (WVar5 == L'\0') goto LAB_00b4c380;
        str = pWVar14 + 1;
      } while ((ushort)WVar5 < 0x21);
      switch(WVar5) {
      case L'(':
        WVar5 = *str;
        if (WVar5 != L'\0') {
          iVar7 = 1;
          pWVar14 = pWVar14 + 2;
          do {
            str = pWVar14;
            if (WVar5 == L')') {
              iVar7 = iVar7 + -1;
              if (iVar7 < 1) break;
            }
            else if (WVar5 == L'(') {
              iVar7 = iVar7 + 1;
            }
            WVar5 = *str;
            pWVar14 = str + 1;
          } while (WVar5 != L'\0');
        }
        goto switchD_00b4b7dc_caseD_2c;
      case L'+':
      case L'-':
        local_60 = (ulong)(WVar5 == L'+' ^ 5);
      case L',':
      case L'/':
        goto switchD_00b4b7dc_caseD_2c;
      default:
        if (WVar5 == L':') goto switchD_00b4b7dc_caseD_2c;
      case L')':
      case L'*':
      case L'.':
        if ((0x7f < (ushort)WVar5) || (iVar7 = isalpha((uint)(ushort)WVar5), iVar7 == 0)) {
          if (((ushort)WVar5 < 0x80) && (uVar8 = (ushort)WVar5 - 0x30, uVar8 < 10)) {
            lVar13 = 2;
            do {
              if ((((uint)local_60 & 0xfffffffe) != 4) ||
                 (*(short *)((long)pWVar14 + lVar13) != 0x3a)) {
                uVar2 = *(ushort *)((long)pWVar14 + lVar13);
                if ((0x7f < uVar2) || (9 < uVar2 - 0x30)) goto LAB_00b4bb40;
                if (0xc < lVar13) break;
                uVar8 = ((uint)uVar2 + uVar8 * 10) - 0x30;
              }
              lVar13 = lVar13 + 2;
            } while( true );
          }
          goto LAB_00b4c380;
        }
        uVar8 = (uint)(ushort)*str;
        if ((ushort)*str < 0x80) {
          do {
            iVar7 = isalpha(uVar8);
            if (((short)uVar8 != 0x2e) && (iVar7 == 0)) break;
            uVar8 = (uint)(ushort)str[1];
            str = str + 1;
          } while (uVar8 < 0x80);
        }
        uVar11 = (long)str - (long)pWVar14;
        WVar5 = pWVar14[(long)(uVar11 * 0x80000000 + -0x100000000) >> 0x20];
        WVar1 = *str;
        while ((WVar1 != L'\0' &&
               (((ushort)WVar1 < 0x21 ||
                (bVar4 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)WVar1), bVar4))))) {
          WVar1 = str[1];
          str = str + 1;
        }
        iVar7 = (int)(uVar11 >> 1) - (uint)(WVar5 == L'.');
        if (iVar7 == 1) goto LAB_00b4c380;
        puVar12 = &ES5Array::vtable;
        while ((*(short *)(puVar12 + -8) < iVar7 ||
               (iVar9 = bcmp(pWVar14,*(void **)(puVar12 + -0x10),(long)iVar7 * 2), iVar9 != 0))) {
          puVar12 = puVar12 + -0x10;
          if (puVar12 < (undefined *)0x150a4c1) goto LAB_00b4c380;
        }
      }
      switch(*(undefined2 *)(puVar12 + -6)) {
      case 0:
        if (local_94 != 0) goto LAB_00b4c380;
        local_94 = *(int *)(puVar12 + -4);
        break;
      case 1:
        goto switchD_00b4ba90_caseD_1;
      case 3:
        goto LAB_00b4c380;
      case 4:
        if (local_b0 != 0) goto LAB_00b4c380;
        local_b0 = *(int *)(puVar12 + -4);
      }
    } while( true );
  }
  goto LAB_00b4c399;
LAB_00b4bb40:
  str = (WCHAR *)((long)pWVar14 + lVar13);
  WVar5 = *(WCHAR *)((long)pWVar14 + lVar13);
  while ((WVar5 != L'\0' &&
         (((ushort)WVar5 < 0x21 ||
          (bVar4 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)WVar5), bVar4))))) {
    WVar5 = str[1];
    str = str + 1;
  }
  switch((uint)local_60) {
  case 1:
    if (0x3b < (int)uVar8) goto LAB_00b4c380;
    local_60 = (ulong)((uint)(WVar5 == L':') * 2);
    str = (WCHAR *)((long)str + local_60);
    break;
  case 2:
    if (0x3b < (int)uVar8) goto LAB_00b4c380;
    str = str + (WVar5 == L'.');
    local_60 = (ulong)((uint)(WVar5 == L'.') * 3);
    break;
  case 3:
    if (((ulong)(lVar13 >> 1) < 2) || (lVar13 == 4)) {
      local_60 = 0;
    }
    else {
      local_60 = 0;
    }
    break;
  case 4:
  case 5:
    goto LAB_00b4c380;
  case 6:
    goto LAB_00b4c380;
  case 7:
    goto LAB_00b4c380;
  case 8:
    goto LAB_00b4c380;
  default:
    goto LAB_00b4c380;
  }
  goto switchD_00b4b7dc_caseD_2c;
switchD_00b4ba90_caseD_1:
LAB_00b4c380:
  ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
LAB_00b4c399:
  *retVal = NAN;
LAB_00b4c39f:
  return ulength < 0x7fffffff;
}

Assistant:

bool DateImplementation::UtcTimeFromStrCore(
        __in_ecount_z(ulength) const char16 *psz,
        unsigned int ulength,
        double &retVal,
        ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        if (ulength >= 0x7fffffff)
        {
            //Prevent unreasonable requests from causing overflows.
            return false;
        }

        if (nullptr == psz)
        {
            retVal = JavascriptNumber::NaN;
            return true;
        }

        // Try to parse the string as the ISO format first
        if(TryParseIsoString(psz, ulength, retVal, scriptContext))
        {
            return true;
        }

        enum
        {
            ssNil,
            ssMinutes,
            ssSeconds,
            ssMillisecond,
            ssAddOffset,
            ssSubOffset,
            ssDate,
            ssMonth,
            ssYear
        };

        char16 *pchBase;
        char16 *pch;
        char16 ch;
        char16 *pszSrc = nullptr;

        const int32 lwNil = 0x80000000;
        int32 cch;
        int32 depth;
        int32 lwT;
        int32 lwYear = lwNil;
        int32 lwMonth = lwNil;
        int32 lwDate = lwNil;
        int32 lwTime = lwNil;
        int32 lwMillisecond = lwNil;
        int32 lwZone = lwNil;
        int32 lwOffset = lwNil;

        int32 ss = ssNil;
        const SZS *pszs;

        bool fUtc;

        int tAmPm = 0;
        int tBcAd = 0;

        size_t numOfDigits = 0;
        double tv = JavascriptNumber::NaN; // Initialized for error handling.

        //Create a copy to analyze
        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("UtcTimeFromStr"));

        pszSrc = AnewArray(tempAllocator, char16, ulength + 1);

        size_t size = sizeof(char16) * (ulength + 1);
        js_memcpy_s(pszSrc, size, psz, size);

        _wcslwr_s(pszSrc,ulength+1);
        bool isDateNegativeVersion5 = false;
        bool isNextFieldDateNegativeVersion5 = false;
        bool isZeroPaddedYear = false;
        const Js::CharClassifier *classifier = scriptContext->GetCharClassifier();
        #pragma prefast(suppress: __WARNING_INCORRECT_VALIDATION, "pch is guaranteed to be null terminated by __in_z on psz and js_memcpy_s copying the null byte")
        for (pch = pszSrc; 0 != (ch = classifier->SkipBiDirectionalChars(pch));)
        {
            pch++;
            if (ch <= ' ')
            {
                continue;
            }

            switch (ch)
            {
                case '(':
                {
                    // skip stuff in parens
                    for (depth = 1; 0 != (ch = *pch); )
                    {
                        pch++;
                        if (ch == '(')
                        {
                            depth++;
                        }
                        else if (ch == ')' && --depth <= 0)
                        {
                            break;
                        }
                    }
                    continue;
                }
                case ',':
                case ':':
                case '/':
                {
                    // ignore these
                    continue;
                }
                case '+':
                case '-':
                {
                    if (lwNil == lwTime)
                    {
                        goto LError;
                    }
                    ss = (ch == '+') ? ssAddOffset : ssSubOffset;
                    continue;
                }
            }


            pchBase = pch - 1;
            if (!FBig(ch) && isalpha(ch))
            {
                for ( ; !FBig(*pch) && (isalpha(*pch) || '.' == *pch); pch++)
                    ;

                cch = (int32)(pch - pchBase);

                if ('.' == pchBase[cch - 1])
                {
                    cch--;
                }
                //Assert(cch > 0);

                // skip to the next real character
                while (0 != (*pch) && (*pch <= ' ' || classifier->IsBiDirectionalChar(*pch)))
                {
                    pch++;
                }

                // have an alphabetic token - look it up
                if (cch == 1)
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    // military version of time zone
                    // z = GMT
                    // j isn't used
                    // a to m are 1 to 12
                    // n to y are -1 to -12
                    if (lwNil != lwZone)
                    {
                        goto LError;
                    }
                    if (ch <= 'm')
                    {
                        if (ch == 'j' || ch < 'a')
                        {
                            goto LError;
                        }
                        lwZone = (int32)(ch - 'a' + (ch < 'j')) * 60;
                    }
                    else if (ch <= 'y')
                    {
                        lwZone = -(int32)(ch - 'm') * 60;
                    }
                    else if (ch == 'z')
                    {
                        lwZone = 0;
                    }
                    else
                    {
                        goto LError;
                    }

                    // look for a time zone offset
                    ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                        ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                    continue;
                }

                // look for a token
                for (pszs = g_rgszs + kcszs; ; )
                {
                    if (pszs-- <= g_rgszs)
                        goto LError;
                    if (cch <= pszs->cch &&
                        0 == memcmp(pchBase, pszs->psz, cch * sizeof(char16)))
                    {
                        break;
                    }
                }

                switch (pszs->szst)
                {
                    case ParseStringTokenType::BcAd:
                    {
                        if (tBcAd != 0)
                        {
                            goto LError;
                        }
                        tBcAd = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::AmPm:
                    {
                        if (tAmPm != 0)
                        {
                            goto LError;
                        }
                        tAmPm = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::Month:
                    {
                        if (lwNil != lwMonth)
                        {
                            goto LError;
                        }
                        lwMonth = pszs->lwVal;
                        if ('-' == *pch)
                        {
                            // handle the case date is negative for "Thu, 23 Sep -0007 00:00:00 GMT"
                            isDateNegativeVersion5 = true;
                            pch++;
                        }
                        break;
                    }
                    case ParseStringTokenType::Zone:
                    {
                        if (lwNil != lwZone)
                        {
                            goto LError;
                        }
                        lwZone = pszs->lwVal;

                        // look for a time zone offset
                        ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                            ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                        break;
                    }
                }
                continue;
            }

            if (FBig(ch) || !isdigit(ch))
            {
                goto LError;
            }

            for (lwT = ch - '0'; ; pch++)
            {
                // for time zone offset HH:mm, we already got HH so skip ':' and grab mm
                if (((ss == ssAddOffset) || (ss == ssSubOffset)) && (*pch == ':')) 
                {
                    continue;
                }
                if (FBig(*pch) || !isdigit(*pch))
                {
                    break;
                }
                // to avoid overflow
                if (pch - pchBase > 6)
                {
                    goto LError;
                }
                // convert string to number, e.g. 07:30 -> 730
                lwT = lwT * 10 + *pch - '0';
            }

            numOfDigits = pch - pchBase;
            // skip to the next real character
            while (0 != (ch = *pch) && (ch <= ' ' || classifier->IsBiDirectionalChar(ch)))
            {
                pch++;
            }

            switch (ss)
            {
                case ssAddOffset:
                case ssSubOffset:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwOffset || lwNil == lwTime)
                        goto LError;
                    // convert into minutes, e.g. 730 -> 7*60+30
                    lwOffset = lwT < 24 ? lwT * 60 :
                        (lwT % 100) + (lwT / 100) * 60;
                    if (ssSubOffset == ss)
                        lwOffset = -lwOffset;
                    lwZone = 0; // An offset is always with respect to UTC
                    ss = ssNil;
                    break;
                }
                case ssMinutes:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT * 60;
                    ss = (ch == ':') ? (pch++, ssSeconds) : ssNil;
                    break;
                }
                case ssSeconds:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT;
                    ss = (ch == '.') ? (pch++, ssMillisecond) : ssNil;
                    break;
                }
                case ssMillisecond:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (numOfDigits <= 1)
                    {
                        // 1 digit only, treat it as hundreds
                        lwMillisecond = lwT * 100;
                    }
                    else if (numOfDigits <= 2)
                    {
                        // 2 digit only, treat it as tens
                        lwMillisecond = lwT * 10;
                    }
                    else if (numOfDigits <= 3)
                    {
                        // canonical 3 digit, per EcmaScript spec
                        lwMillisecond = lwT;
                    }
                    else
                    {
                        // ignore any digits beyond the third
                        lwMillisecond = (pchBase[0] - '0') * 100 + (pchBase[1] - '0') * 10 + (pchBase[2] - '0');
                    }

                    ss = ssNil;
                    break;
                }
                case ssDate:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwDate)
                        goto LError;
                    lwDate = lwT;

                    if ((lwNil == lwYear) && FDateDelimiter(ch))
                    {
                        // We have already parsed the year if the date is specified as YYYY/MM/DD,
                        // but not when it is specified as MM/DD/YYYY.
                        ss = ssYear;
                        pch++;
                    }
                    else
                    {
                        ss = ssNil;
                    }
                    break;
                }
                case ssMonth:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwMonth)
                    {
                        goto LError;
                    }

                    lwMonth = lwT - 1;

                    if (FDateDelimiter(ch))
                    {
                        // Mark the next token as the date so that it won't be confused with another token.
                        // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                        // the time offset without this.
                        ss = ssDate;
                        pch++;
                    }

                    break;
                }
                case ssYear:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwYear)
                        goto LError;

                    AssertMsg(isDateNegativeVersion5 == false, "lwYear should be positive as pre-version:5 parsing");
                    lwYear = lwT;
                    ss = ssNil;
                    if (lwT < 1000 && numOfDigits >= 4)
                    {
                        isZeroPaddedYear = true;
                    }
                    break;
                }
                default:
                {
                    // assumptions for getting a YEAR:
                    //    - an absolute value greater or equal than 70 (thus not hour!)
                    //    - wasn't preceded by negative sign for -version:5 year format
                    //    - lwT has at least 4 digits (e.g. 0017 is year 17 AD)
                    if (lwT >= 70 || isNextFieldDateNegativeVersion5 || numOfDigits >= 4)
                    {
                        // assume it's a year - this is used particularly as version:5 year parsing
                        if (lwNil != lwYear)
                            goto LError;

                        // handle the case date is negative for "Tue Feb 02 -2012 01:02:03 GMT-0800"
                        lwYear = isDateNegativeVersion5 ? -lwT : lwT;
                        isNextFieldDateNegativeVersion5 = false;

                        if (lwT < 1000 && numOfDigits >= 4)
                        {
                            isZeroPaddedYear = true;
                        }

                        if (FDateDelimiter(ch))
                        {
                            // Mark the next token as the month so that it won't be confused with another token.
                            // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                            // the time offset without this.
                            ss = ssMonth;
                            pch++;
                        }

                        break;
                    }

                    switch (ch)
                    {
                        case ':':
                        {
                            // hour
                            if (lwNil != lwTime)
                                goto LError;
                            if (lwT >= 24)
                                goto LError;
                            lwTime = lwT * 3600;
                            ss = ssMinutes;
                            pch++;
                            break;
                        }
                        case '/':
                        case '-':
                        {
                            // month
                            if (lwNil != lwMonth)
                            {
                                // can be year
                                if (lwNil != lwYear)
                                {
                                    // both were already parsed!
                                    goto LError;
                                }
                                else
                                {
                                    // this is a day - with the negative sign for the date (version 5+)
                                    lwDate = lwT;
                                    isDateNegativeVersion5 = true;

                                    // mark the next field to be year (version 5+)
                                    isNextFieldDateNegativeVersion5 = true;
                                }
                            }
                            else
                            {
                                // this is a month
                                lwMonth = lwT - 1;
                                ss = ssDate;
                            }
                            pch++;
                            break;
                        }
                        default:
                        {
                            // date
                            if (lwNil != lwDate)
                                goto LError;
                            lwDate = lwT;
                            break;
                        }
                    }
                    break;
                }
            }
            continue;
        }

        if (lwNil == lwYear ||
            lwNil == lwMonth || lwMonth > 11 ||
            lwNil == lwDate || lwDate > 31)
        {
            goto LError;
        }

        if (tBcAd != 0)
        {
            if (tBcAd < 0)
            {
                // BC. Note that 1 BC is year 0 and 2 BC is year -1.
                lwYear = -lwYear + 1;
            }
        }
        else if (lwYear < 50 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 2000;
        }
        else if (lwYear < 100 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 1900;
        }


        if (tAmPm != 0)
        {
            if (lwNil == lwTime)
            {
                goto LError;
            }
            if (lwTime >= 12 * 3600L && lwTime < 13 * 3600L)
            {
                // In the 12:00 hour. AM means subtract 12 hours and PM means
                // do nothing.
                if (tAmPm < 0)
                {
                    lwTime -= 12 * 3600L;
                }
            }
            else
            {
                // Not in the 12:00 hour. AM means do nothing and PM means
                // add 12 hours.
                if (tAmPm > 0)
                {
                    if (lwTime >= 12 * 3600L)
                    {
                        goto LError;
                    }
                    lwTime += 12 * 3600L;
                }
            }
        }
        else if (lwNil == lwTime)
        {
            lwTime = 0;
        }

        if (lwNil == lwMillisecond)
        {
            lwMillisecond = 0;
        }

        if (lwNil != lwZone)
        {
            lwTime -= lwZone * 60;
            fUtc = TRUE;
        }
        else
        {
            fUtc = FALSE;
        }
        if (lwNil != lwOffset)
        {
            lwTime -= lwOffset * 60;
        }

        // Rebuild time.
        tv = TvFromDate(lwYear, lwMonth, lwDate - 1, (double)lwTime * 1000 + lwMillisecond);
        if (!fUtc)
        {
            tv = GetTvUtc(tv, scriptContext);
        }

LError:
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);
        retVal = tv;
        return true;
    }